

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O1

char * __thiscall icu_63::Package::allocString(Package *this,UBool in,int32_t length)

{
  uint uVar1;
  int iVar2;
  char *__s2;
  bool bVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint extraout_EDX;
  Item *pIVar8;
  undefined7 in_register_00000031;
  char *__s1;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  
  __s1 = (char *)CONCAT71(in_register_00000031,in);
  iVar6 = this->inStringTop;
  iVar2 = this->outStringTop;
  iVar7 = iVar2;
  if (in != '\0') {
    iVar7 = iVar6;
  }
  iVar7 = length + iVar7 + 1;
  if (iVar7 < 0x186a1) {
    if (in != '\0') {
      this->inStringTop = iVar7;
      return this->inStrings + iVar6;
    }
    this->outStringTop = iVar7;
    return this->outStrings + iVar2;
  }
  allocString();
  uVar11 = this->itemCount;
  if ((int)uVar11 < 1) {
    return (char *)0xffffffff;
  }
  pIVar8 = this->items;
  uVar9 = 0;
  while( true ) {
    uVar1 = uVar11 + uVar9;
    uVar5 = uVar1 >> 1;
    pcVar4 = (char *)(ulong)uVar5;
    __s2 = pIVar8[(long)pcVar4].name;
    if ((int)extraout_EDX < 0) {
      iVar6 = strcmp(__s1,__s2);
    }
    else {
      iVar6 = strncmp(__s1,__s2,(ulong)extraout_EDX);
    }
    if (iVar6 == 0) break;
    if (-1 < iVar6) {
      uVar9 = uVar5 + 1;
      uVar5 = uVar11;
    }
    uVar11 = uVar5;
    if ((int)uVar11 <= (int)uVar9) {
      return (char *)(ulong)~uVar9;
    }
  }
  if ((int)extraout_EDX < 0) {
    return pcVar4;
  }
  if (1 < uVar1) {
    pIVar8 = this->items + (uVar1 >> 1);
    uVar10 = (ulong)(uVar1 >> 1);
    do {
      pIVar8 = pIVar8 + -1;
      iVar6 = strncmp(__s1,pIVar8->name,(ulong)extraout_EDX);
      if (iVar6 != 0) {
        return (char *)(uVar10 & 0xffffffff);
      }
      bVar3 = 1 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar3);
    return (char *)0x0;
  }
  return pcVar4;
}

Assistant:

char *
Package::allocString(UBool in, int32_t length) {
    char *p;
    int32_t top;

    if(in) {
        top=inStringTop;
        p=inStrings+top;
    } else {
        top=outStringTop;
        p=outStrings+top;
    }
    top+=length+1;

    if(top>STRING_STORE_SIZE) {
        fprintf(stderr, "icupkg: string storage overflow\n");
        exit(U_BUFFER_OVERFLOW_ERROR);
    }
    if(in) {
        inStringTop=top;
    } else {
        outStringTop=top;
    }
    return p;
}